

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStoreGeometryStages::Write<tcu::Vector<int,4>>
          (BasicAllFormatsStoreGeometryStages *this,GLenum internalformat,
          Vector<int,_4> *write_value,Vector<int,_4> *expected_value)

{
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLenum type;
  GLint GVar4;
  GLenum GVar5;
  char *pcVar6;
  char *src_tcs;
  char *src_tes;
  char *src_gs;
  reference pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  string local_198;
  Vector<int,_4> local_178;
  string local_168;
  Vector<int,_4> local_148;
  string local_138;
  int local_114;
  uint local_110;
  int i_2;
  GLuint i_1;
  int i;
  GLuint texture [4];
  allocator<tcu::Vector<int,_4>_> local_e9;
  undefined1 local_e8 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  undefined1 local_c8 [4];
  int kSize;
  string local_a8;
  string local_78;
  string local_58;
  GLuint local_34;
  Vector<int,_4> *pVStack_30;
  GLuint program;
  Vector<int,_4> *expected_value_local;
  Vector<int,_4> *write_value_local;
  BasicAllFormatsStoreGeometryStages *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsStoreGeometryStages *this_local;
  
  pVStack_30 = expected_value;
  expected_value_local = write_value;
  write_value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenVS<tcu::Vector<int,4>>(&local_58,this,internalformat,write_value);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  GenTCS<tcu::Vector<int,4>>(&local_78,this,write_value_local._4_4_,expected_value_local);
  src_tcs = (char *)std::__cxx11::string::c_str();
  GenTES<tcu::Vector<int,4>>(&local_a8,this,write_value_local._4_4_,expected_value_local);
  src_tes = (char *)std::__cxx11::string::c_str();
  GenGS<tcu::Vector<int,4>>((string *)local_c8,this,write_value_local._4_4_,expected_value_local);
  src_gs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,pcVar6,src_tcs,src_tes,src_gs,(char *)0x0,
                     (bool *)0x0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  local_34 = GVar2;
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_e9);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_e8,1,
             &local_e9);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_e9);
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),4,&i_1);
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,(&i_1)[i_2]);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2800,0x2600);
    GVar5 = write_value_local._4_4_;
    GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
    type = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        local_e8,0);
    glu::CallLogWrapper::glTexImage3D
              ((CallLogWrapper *)(this + 8),0x8c1a,0,GVar5,1,1,1,0,GVar3,type,pvVar7);
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image0");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar4,0);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image1");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar4,1);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image2");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar4,2);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image3");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar4,3);
  for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)(this + 8),local_110,(&i_1)[local_110],0,'\x01',0,0x88b9,
               write_value_local._4_4_);
  }
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,1);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,3);
  local_114 = 0;
  do {
    if (3 < local_114) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),4,&i_1);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
      this_local._7_1_ = 1;
LAB_0104b02e:
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_e8);
      return (bool)(this_local._7_1_ & 1);
    }
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,(&i_1)[local_114]);
    glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
    GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
    GVar3 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        local_e8,0);
    glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0x8c1a,0,GVar5,GVar3,pvVar7);
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        local_e8,0);
    bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this,pvVar7,pVStack_30,write_value_local._4_4_);
    if (!bVar1) {
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),4,&i_1);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
      pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          local_e8,0);
      tcu::Vector<int,_4>::Vector(&local_148,pvVar7);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_138,(ShaderImageLoadStoreBase *)this,&local_148);
      uVar8 = std::__cxx11::string::c_str();
      tcu::Vector<int,_4>::Vector(&local_178,pVStack_30);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_168,(ShaderImageLoadStoreBase *)this,&local_178);
      uVar9 = std::__cxx11::string::c_str();
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_198,(ShaderImageLoadStoreBase *)this,write_value_local._4_4_);
      uVar10 = std::__cxx11::string::c_str();
      pcVar6 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                         ((ShaderImageLoadStoreBase *)this,local_114);
      gl4cts::anon_unknown_0::Output
                ("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n",uVar8,uVar9,
                 uVar10,pcVar6);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_138);
      this_local._7_1_ = 0;
      goto LAB_0104b02e;
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLuint program =
			BuildProgram(GenVS(internalformat, write_value).c_str(), GenTCS(internalformat, write_value).c_str(),
						 GenTES(internalformat, write_value).c_str(), GenGS(internalformat, write_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture[4];
		glGenTextures(4, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str(), StageName(i));
				return false;
			}
		}
		glDeleteTextures(4, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}